

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::UserGeometryISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,UserGeometryISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  float fVar4;
  undefined4 uVar5;
  int iVar6;
  size_t itime;
  ulong uVar7;
  int iVar8;
  size_t itime_00;
  float fVar9;
  unsigned_long uVar10;
  float fVar11;
  BBox1f BVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar26;
  float fVar27;
  undefined1 auVar24 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar25;
  float fVar28;
  float fVar32;
  float fVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar31;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  size_t local_1b8;
  size_t local_198;
  BBox<embree::Vec3fa> bupper1;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  BBox3fa box;
  anon_class_16_2_4e716a3c local_e0;
  ulong local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  BVar12 = Geometry::getTimeRange((Geometry *)this);
  fVar4 = time_range->lower;
  if (time_range->lower <= BVar12.lower) {
    fVar4 = BVar12.lower;
  }
  fStack_c4 = BVar12.upper;
  local_c8 = fStack_c4;
  if (time_range->upper <= fStack_c4) {
    local_c8 = time_range->upper;
  }
  if (fVar4 <= local_c8) {
    uVar10 = r->_begin;
    local_198 = 0;
    local_148 = _DAT_01f45a40;
    local_158 = _DAT_01f45a30;
    local_b8 = _DAT_01f45a40;
    local_a8 = _DAT_01f45a30;
    local_1b8 = k;
    fStack_c0 = fStack_c4;
    fStack_bc = fStack_c4;
    for (; uVar10 < r->_end; uVar10 = uVar10 + 1) {
      BVar12 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
      fVar9 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
      fVar23 = BVar12.lower;
      fVar17 = BVar12.upper - fVar23;
      fVar19 = local_c8 - fVar23;
      fVar11 = floorf(((fVar4 - fVar23) / fVar17) * 1.0000002 * fVar9);
      fVar23 = 0.0;
      if (0.0 <= fVar11) {
        fVar23 = fVar11;
      }
      fVar11 = ceilf((fVar19 / fVar17) * 0.99999976 * fVar9);
      if (fVar9 <= fVar11) {
        fVar11 = fVar9;
      }
      uVar7 = (ulong)(int)fVar23;
      while (fVar9 = (float)uVar10, uVar7 <= (ulong)(long)(int)fVar11) {
        bupper1.lower.field_0._0_8_ =
             (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        bupper1.lower.field_0.m128[3] = (float)(int)uVar7;
        bupper1.upper.field_0._0_8_ = &box;
        bupper1.lower.field_0.m128[2] = fVar9;
        uVar5 = (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                          (&bupper1);
        auVar24._0_4_ =
             -(uint)((box.upper.field_0.m128[0] < 1.844e+18 &&
                     -1.844e+18 < box.lower.field_0.m128[0]) &&
                    box.lower.field_0.m128[0] <= box.upper.field_0.m128[0]);
        auVar24._4_4_ =
             -(uint)((box.upper.field_0.m128[1] < 1.844e+18 &&
                     -1.844e+18 < box.lower.field_0.m128[1]) &&
                    box.lower.field_0.m128[1] <= box.upper.field_0.m128[1]);
        auVar24._8_4_ =
             -(uint)((box.upper.field_0.m128[2] < 1.844e+18 &&
                     -1.844e+18 < box.lower.field_0.m128[2]) &&
                    box.lower.field_0.m128[2] <= box.upper.field_0.m128[2]);
        auVar24._12_4_ =
             -(uint)((box.upper.field_0.m128[3] < 1.844e+18 &&
                     -1.844e+18 < box.lower.field_0.m128[3]) &&
                    box.lower.field_0.m128[3] <= box.upper.field_0.m128[3]);
        uVar5 = movmskps(uVar5,auVar24);
        uVar7 = uVar7 + 1;
        if ((~(byte)uVar5 & 7) != 0) goto LAB_001b0dd4;
      }
      local_e0.primID = &local_d0;
      fVar23 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
      fVar11 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.lower;
      fVar19 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.upper - fVar11;
      fVar20 = (fVar4 - fVar11) / fVar19;
      fVar19 = (local_c8 - fVar11) / fVar19;
      fVar21 = fVar23 * fVar19;
      local_e0.this = (AccelSet *)this;
      local_d0 = uVar10;
      fVar11 = floorf(fVar23 * fVar20);
      fVar17 = ceilf(fVar21);
      iVar6 = (int)fVar11;
      if (fVar11 <= 0.0) {
        fVar11 = 0.0;
      }
      fVar14 = fVar17;
      if (fVar23 <= fVar17) {
        fVar14 = fVar23;
      }
      iVar8 = -1;
      if (-1 < iVar6) {
        iVar8 = iVar6;
      }
      iVar3 = (int)fVar23 + 1;
      if ((int)fVar17 < (int)fVar23 + 1) {
        iVar3 = (int)fVar17;
      }
      AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()(&box,&local_e0,(long)(int)fVar11)
      ;
      AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&bupper1,&local_e0,(long)(int)fVar14);
      fVar17 = fVar23 * fVar20 - fVar11;
      if (iVar3 - iVar8 == 1) {
        if (fVar17 <= 0.0) {
          fVar17 = 0.0;
        }
        fVar23 = 1.0 - fVar17;
        auVar29._0_4_ = fVar23 * box.lower.field_0.m128[0] + fVar17 * bupper1.lower.field_0.m128[0];
        auVar29._4_4_ = fVar23 * box.lower.field_0.m128[1] + fVar17 * bupper1.lower.field_0.m128[1];
        auVar29._8_4_ = fVar23 * box.lower.field_0.m128[2] + fVar17 * bupper1.lower.field_0.m128[2];
        auVar29._12_4_ = fVar23 * box.lower.field_0.m128[3] + fVar17 * bupper1.lower.field_0.m128[3]
        ;
        auVar30._0_4_ = fVar23 * box.upper.field_0.m128[0] + fVar17 * bupper1.upper.field_0.m128[0];
        auVar30._4_4_ = fVar23 * box.upper.field_0.m128[1] + fVar17 * bupper1.upper.field_0.m128[1];
        auVar30._8_4_ = fVar23 * box.upper.field_0.m128[2] + fVar17 * bupper1.upper.field_0.m128[2];
        auVar30._12_4_ = fVar23 * box.upper.field_0.m128[3] + fVar17 * bupper1.upper.field_0.m128[3]
        ;
        fVar14 = fVar14 - fVar21;
        if (fVar14 <= 0.0) {
          fVar14 = 0.0;
        }
        fVar23 = 1.0 - fVar14;
        fVar35 = bupper1.lower.field_0.m128[0] * fVar23 + box.lower.field_0.m128[0] * fVar14;
        fVar36 = bupper1.lower.field_0.m128[1] * fVar23 + box.lower.field_0.m128[1] * fVar14;
        fVar37 = bupper1.lower.field_0.m128[2] * fVar23 + box.lower.field_0.m128[2] * fVar14;
        fVar38 = bupper1.lower.field_0.m128[3] * fVar23 + box.lower.field_0.m128[3] * fVar14;
        fVar11 = fVar23 * bupper1.upper.field_0.m128[0] + fVar14 * box.upper.field_0.m128[0];
        fVar21 = fVar23 * bupper1.upper.field_0.m128[1] + fVar14 * box.upper.field_0.m128[1];
        fVar22 = fVar23 * bupper1.upper.field_0.m128[2] + fVar14 * box.upper.field_0.m128[2];
        fVar17 = fVar23 * bupper1.upper.field_0.m128[3] + fVar14 * box.upper.field_0.m128[3];
      }
      else {
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&blower1,&local_e0,(long)((int)fVar11 + 1));
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&bupper0,&local_e0,(long)((int)fVar14 + -1));
        if (fVar17 <= 0.0) {
          fVar17 = 0.0;
        }
        fVar11 = 1.0 - fVar17;
        auVar29._0_4_ = box.lower.field_0.m128[0] * fVar11 + blower1.lower.field_0.m128[0] * fVar17;
        auVar29._4_4_ = box.lower.field_0.m128[1] * fVar11 + blower1.lower.field_0.m128[1] * fVar17;
        auVar29._8_4_ = box.lower.field_0.m128[2] * fVar11 + blower1.lower.field_0.m128[2] * fVar17;
        auVar29._12_4_ = box.lower.field_0.m128[3] * fVar11 + blower1.lower.field_0.m128[3] * fVar17
        ;
        auVar30._0_4_ = fVar11 * box.upper.field_0.m128[0] + fVar17 * blower1.upper.field_0.m128[0];
        auVar30._4_4_ = fVar11 * box.upper.field_0.m128[1] + fVar17 * blower1.upper.field_0.m128[1];
        auVar30._8_4_ = fVar11 * box.upper.field_0.m128[2] + fVar17 * blower1.upper.field_0.m128[2];
        auVar30._12_4_ = fVar11 * box.upper.field_0.m128[3] + fVar17 * blower1.upper.field_0.m128[3]
        ;
        fVar14 = fVar14 - fVar21;
        if (fVar14 <= 0.0) {
          fVar14 = 0.0;
        }
        fVar17 = 1.0 - fVar14;
        fVar35 = bupper1.lower.field_0.m128[0] * fVar17 + bupper0.lower.field_0.m128[0] * fVar14;
        fVar36 = bupper1.lower.field_0.m128[1] * fVar17 + bupper0.lower.field_0.m128[1] * fVar14;
        fVar37 = bupper1.lower.field_0.m128[2] * fVar17 + bupper0.lower.field_0.m128[2] * fVar14;
        fVar38 = bupper1.lower.field_0.m128[3] * fVar17 + bupper0.lower.field_0.m128[3] * fVar14;
        fVar11 = fVar17 * bupper1.upper.field_0.m128[0] + fVar14 * bupper0.upper.field_0.m128[0];
        fVar21 = fVar17 * bupper1.upper.field_0.m128[1] + fVar14 * bupper0.upper.field_0.m128[1];
        fVar22 = fVar17 * bupper1.upper.field_0.m128[2] + fVar14 * bupper0.upper.field_0.m128[2];
        fVar17 = fVar17 * bupper1.upper.field_0.m128[3] + fVar14 * bupper0.upper.field_0.m128[3];
        if (iVar6 < 0) {
          iVar6 = -1;
        }
        itime_00 = (size_t)iVar6;
        while (itime_00 = itime_00 + 1, (long)itime_00 < (long)iVar3) {
          fVar14 = ((float)(int)itime_00 / fVar23 - fVar20) / (fVar19 - fVar20);
          fVar18 = 1.0 - fVar14;
          fVar32 = auVar29._4_4_;
          fVar33 = auVar29._8_4_;
          fVar34 = auVar29._12_4_;
          fVar26 = auVar30._4_4_;
          fVar27 = auVar30._8_4_;
          fVar28 = auVar30._12_4_;
          AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_e0,itime_00);
          auVar16._0_4_ = bi.lower.field_0.m128[0] - (auVar29._0_4_ * fVar18 + fVar35 * fVar14);
          auVar16._4_4_ = bi.lower.field_0.m128[1] - (fVar32 * fVar18 + fVar36 * fVar14);
          auVar16._8_4_ = bi.lower.field_0.m128[2] - (fVar33 * fVar18 + fVar37 * fVar14);
          auVar16._12_4_ = bi.lower.field_0.m128[3] - (fVar34 * fVar18 + fVar38 * fVar14);
          auVar15._0_4_ = bi.upper.field_0.m128[0] - (fVar18 * auVar30._0_4_ + fVar14 * fVar11);
          auVar15._4_4_ = bi.upper.field_0.m128[1] - (fVar18 * fVar26 + fVar14 * fVar21);
          auVar15._8_4_ = bi.upper.field_0.m128[2] - (fVar18 * fVar27 + fVar14 * fVar22);
          auVar15._12_4_ = bi.upper.field_0.m128[3] - (fVar18 * fVar28 + fVar14 * fVar17);
          auVar24 = minps(auVar16,ZEXT816(0));
          auVar16 = maxps(auVar15,ZEXT816(0));
          auVar29._0_4_ = auVar29._0_4_ + auVar24._0_4_;
          auVar29._4_4_ = fVar32 + auVar24._4_4_;
          auVar29._8_4_ = fVar33 + auVar24._8_4_;
          auVar29._12_4_ = fVar34 + auVar24._12_4_;
          fVar35 = fVar35 + auVar24._0_4_;
          fVar36 = fVar36 + auVar24._4_4_;
          fVar37 = fVar37 + auVar24._8_4_;
          fVar38 = fVar38 + auVar24._12_4_;
          auVar30._0_4_ = auVar30._0_4_ + auVar16._0_4_;
          auVar30._4_4_ = fVar26 + auVar16._4_4_;
          auVar30._8_4_ = fVar27 + auVar16._8_4_;
          auVar30._12_4_ = fVar28 + auVar16._12_4_;
          fVar11 = fVar11 + auVar16._0_4_;
          fVar21 = fVar21 + auVar16._4_4_;
          fVar22 = fVar22 + auVar16._8_4_;
          fVar17 = fVar17 + auVar16._12_4_;
        }
      }
      auVar1._4_4_ = fVar21;
      auVar1._0_4_ = fVar11;
      auVar1._8_4_ = fVar22;
      auVar1._12_4_ = fVar17;
      auVar24 = maxps(auVar30,auVar1);
      auVar2._4_4_ = fVar36;
      auVar2._0_4_ = fVar35;
      auVar2._8_4_ = fVar37;
      auVar2._12_4_ = fVar38;
      auVar30 = minps(auVar29,auVar2);
      aVar31._0_12_ = auVar30._0_12_;
      aVar31.m128[3] = (float)geomID;
      aVar25._0_12_ = auVar24._0_12_;
      aVar25.m128[3] = fVar9;
      local_158 = minps(local_158,(undefined1  [16])aVar31);
      local_148 = maxps(local_148,(undefined1  [16])aVar25);
      auVar13._0_4_ = auVar30._0_4_ + auVar24._0_4_;
      auVar13._4_4_ = auVar30._4_4_ + auVar24._4_4_;
      auVar13._8_4_ = auVar30._8_4_ + auVar24._8_4_;
      auVar13._12_4_ = (float)geomID + fVar9;
      local_a8 = minps(local_a8,auVar13);
      local_b8 = maxps(local_b8,auVar13);
      local_198 = local_198 + 1;
      prims[local_1b8].lower.field_0 = aVar31;
      prims[local_1b8].upper.field_0 = aVar25;
      local_1b8 = local_1b8 + 1;
LAB_001b0dd4:
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_158._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_158._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_148._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_148._8_8_;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
     field_0.m128 = local_a8;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
     field_0.m128 = local_b8;
    __return_storage_ptr__->end = local_198;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }